

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

OBS_TYPE __thiscall
despot::Parser::GetObservation
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference ppCVar8;
  int local_3c;
  OBS_TYPE OStack_38;
  int o;
  OBS_TYPE obs;
  int s;
  double *random_local;
  ACT_TYPE action_local;
  vector<int,_std::allocator<int>_> *state_local;
  Parser *this_local;
  
  obs._4_4_ = 0;
  while( true ) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(state);
    if (sVar4 <= (ulong)(long)obs._4_4_) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)obs._4_4_);
    vVar1 = *pvVar5;
    pvVar6 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)obs._4_4_);
    (pvVar6->super_NamedVar).super_Variable.curr_value = vVar1;
    obs._4_4_ = obs._4_4_ + 1;
  }
  pvVar7 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                     (&this->action_vars_,0);
  (pvVar7->super_Variable).curr_value = action;
  OStack_38 = 0;
  local_3c = 0;
  while( true ) {
    sVar4 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_)
    ;
    if (sVar4 <= (ulong)(long)local_3c) break;
    pvVar7 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_3c);
    iVar2 = Variable::Size(&pvVar7->super_Variable);
    ppCVar8 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                        (&this->obs_funcs_,(long)local_3c);
    iVar3 = (*((*ppCVar8)->super_Function)._vptr_Function[0xe])(*ppCVar8,random);
    OStack_38 = OStack_38 * (long)iVar2 + (long)iVar3;
    local_3c = local_3c + 1;
  }
  return OStack_38;
}

Assistant:

OBS_TYPE Parser::GetObservation(const vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		curr_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	OBS_TYPE obs = 0;
	for (int o = 0; o < obs_vars_.size(); o++) {
		obs = obs * obs_vars_[o].Size()
			+ obs_funcs_[o]->ComputeCurrentIndex(random);
	}
	return obs;
}